

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void make_contained(uc_struct_conflict15 *uc,MemoryRegion_conflict *current)

{
  hwaddr offset;
  undefined1 a [16];
  MemoryRegion_conflict *mr;
  uint64_t size;
  uc_struct_conflict15 *uc_00;
  MemoryRegion_conflict *mr_00;
  MemoryRegion_conflict *container;
  hwaddr addr;
  MemoryRegion_conflict *current_local;
  uc_struct_conflict15 *uc_local;
  
  offset = current->addr;
  mr = (MemoryRegion_conflict *)g_malloc_n(1,0xa0);
  a._8_8_ = mr;
  a._0_8_ = uc;
  uc_00 = uc;
  mr_00 = mr;
  size = int128_get64((Int128)a);
  memory_region_init_tricore(uc_00,mr_00,size);
  memory_region_del_subregion_tricore((MemoryRegion_conflict *)uc->system_memory,current);
  memory_region_add_subregion_overlap_tricore(mr,0,current,current->priority);
  memory_region_add_subregion_tricore((MemoryRegion_conflict *)uc->system_memory,offset,mr);
  return;
}

Assistant:

static void make_contained(struct uc_struct *uc, MemoryRegion *current)
{
    hwaddr addr = current->addr;
    MemoryRegion *container = g_new(MemoryRegion, 1);
    memory_region_init(uc, container, int128_get64(current->size));
    memory_region_del_subregion(uc->system_memory, current);
    memory_region_add_subregion_overlap(container, 0, current, current->priority);
    memory_region_add_subregion(uc->system_memory, addr, container);
}